

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O0

ALuint __thiscall
SampleConverter::convert
          (SampleConverter *this,void **src,ALuint *srcframes,void *dst,ALuint dstframes)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  index_type iVar4;
  uint64_t uVar5;
  reference pCVar6;
  size_t a;
  long lVar7;
  long in_RCX;
  uint *in_RDX;
  long *in_RSI;
  long in_RDI;
  uint in_R8D;
  float *ResampledData;
  size_t len;
  ALuint SrcDataEnd;
  byte *DstSamples;
  byte *SrcSamples;
  size_t chan_1;
  ALuint DstSize;
  uint64_t DataSize64;
  ALuint DataPosFrac;
  float *DstData;
  float *SrcData;
  size_t chan;
  ALuint toread;
  int prepcount;
  ALuint pos;
  FPUCtl mixer_mode;
  ALuint NumSrcSamples;
  byte *SamplesIn;
  ALuint increment;
  ALuint DstFrameSize;
  ALuint SrcFrameSize;
  float *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  uint64_t in_stack_fffffffffffffe78;
  DevFmtType srctype;
  float *in_stack_fffffffffffffe80;
  float *in_stack_fffffffffffffe88;
  float *in_stack_fffffffffffffe90;
  float *in_stack_fffffffffffffe98;
  span<float,_18446744073709551615UL> local_d8;
  float *local_c8;
  undefined4 local_bc;
  size_t local_b8;
  undefined4 local_ac;
  uint local_a8;
  uint64_t local_98;
  long local_90;
  ulong local_88;
  uint local_7c;
  long local_78;
  uint local_6c;
  pointer local_68;
  long local_60;
  ulong local_58;
  uint local_50;
  int local_4c;
  uint local_48;
  FPUCtl local_44;
  uint local_3c;
  long local_38;
  int local_30;
  int local_2c;
  int local_28;
  uint local_24;
  long local_20;
  uint *local_18;
  long *local_10;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar4 = al::FlexArray<SampleConverter::ChanSamples,_16UL>::size
                    ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040));
  local_28 = (int)iVar4 * *(int *)(in_RDI + 4);
  iVar4 = al::FlexArray<SampleConverter::ChanSamples,_16UL>::size
                    ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040));
  local_2c = (int)iVar4 * *(int *)(in_RDI + 8);
  local_30 = *(int *)(in_RDI + 0x14);
  local_38 = *local_10;
  local_3c = *local_18;
  FPUCtl::FPUCtl(&local_44);
  local_48 = 0;
LAB_001c4416:
  do {
    if (local_24 <= local_48 || local_3c == 0) goto LAB_001c4c6b;
    local_4c = *(int *)(in_RDI + 0xc);
    if (-1 < local_4c) {
      local_50 = minu(local_3c,0x3d0);
      if ((0x2f < local_4c) || (0x30U - local_4c < local_50)) {
        local_60 = in_RDI + 0x40;
        local_68 = (pointer)(in_RDI + 0x1040);
        local_6c = *(uint *)(in_RDI + 0x10);
        local_78 = ((ulong)local_50 + (long)local_4c + -0x30) * 0x1000 - (ulong)local_6c;
        uVar5 = clampu64((uint64_t)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                         CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        local_7c = (uint)uVar5;
        local_7c = minu(local_7c,local_24 - local_48);
        for (local_88 = 0; uVar1 = local_88,
            iVar4 = al::FlexArray<SampleConverter::ChanSamples,_16UL>::size
                              ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040)),
            uVar1 < iVar4; local_88 = local_88 + 1) {
          local_90 = local_38 + *(uint *)(in_RDI + 4) * local_88;
          local_98 = local_20 + *(uint *)(in_RDI + 8) * local_88;
          al::FlexArray<SampleConverter::ChanSamples,_16UL>::operator[]
                    ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040),local_88);
          srctype = (DevFmtType)(in_stack_fffffffffffffe78 >> 0x38);
          std::copy_n<float*,int,float*>
                    (in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                     in_stack_fffffffffffffe88);
          al::FlexArray<SampleConverter::ChanSamples,_16UL>::size
                    ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040));
          anon_unknown.dwarf_f0b3e::LoadSamples
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     (size_t)in_stack_fffffffffffffe80,srctype,
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
          local_a8 = local_7c * local_30 + local_6c >> 0xc;
          if (local_a8 < local_4c + local_50) {
            pCVar6 = al::FlexArray<SampleConverter::ChanSamples,_16UL>::operator[]
                               ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040),
                                local_88);
            a = al::size<float,48ul>(pCVar6->PrevSamples);
            local_b8 = minz(a,(ulong)((local_4c + local_50) - local_a8));
            al::FlexArray<SampleConverter::ChanSamples,_16UL>::operator[]
                      ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040),local_88);
            std::copy_n<float*,unsigned_long,float*>
                      (in_stack_fffffffffffffe98,(unsigned_long)in_stack_fffffffffffffe90,
                       in_stack_fffffffffffffe88);
            pCVar6 = al::FlexArray<SampleConverter::ChanSamples,_16UL>::operator[]
                               ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040),
                                local_88);
            std::begin<float,48ul>(pCVar6->PrevSamples);
            pCVar6 = al::FlexArray<SampleConverter::ChanSamples,_16UL>::operator[]
                               ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040),
                                local_88);
            std::end<float,48ul>(pCVar6->PrevSamples);
            local_bc = 0;
            std::fill<float*,float>
                      ((float *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       in_stack_fffffffffffffe68,(float *)0x1c4a69);
          }
          else {
            pCVar6 = al::FlexArray<SampleConverter::ChanSamples,_16UL>::operator[]
                               ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040),
                                local_88);
            std::begin<float,48ul>(pCVar6->PrevSamples);
            pCVar6 = al::FlexArray<SampleConverter::ChanSamples,_16UL>::operator[]
                               ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040),
                                local_88);
            std::end<float,48ul>(pCVar6->PrevSamples);
            local_ac = 0;
            std::fill<float*,float>
                      ((float *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       in_stack_fffffffffffffe68,(float *)0x1c4929);
          }
          iVar2 = local_30;
          uVar3 = local_6c;
          in_stack_fffffffffffffe90 = *(float **)(in_RDI + 0x30);
          in_stack_fffffffffffffe98 = (float *)(in_RDI + 0x18);
          lVar7 = local_60 + 0x60;
          al::span<float,_18446744073709551615UL>::span(&local_d8,local_68,(ulong)local_7c);
          in_stack_fffffffffffffe80 =
               (float *)(*(code *)in_stack_fffffffffffffe90)
                                  (in_stack_fffffffffffffe98,lVar7,uVar3,iVar2,local_d8.mData,
                                   local_d8.mDataEnd);
          in_stack_fffffffffffffe78 = local_98;
          in_stack_fffffffffffffe88 = in_stack_fffffffffffffe80;
          local_c8 = in_stack_fffffffffffffe80;
          al::FlexArray<SampleConverter::ChanSamples,_16UL>::size
                    ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040));
          anon_unknown.dwarf_f0b3e::StoreSamples
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     (size_t)in_stack_fffffffffffffe80,
                     (DevFmtType)(in_stack_fffffffffffffe78 >> 0x38),
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        }
        local_6c = local_30 * local_7c + local_6c;
        iVar2 = mini(local_4c + (local_50 - (local_6c >> 0xc)),0x30);
        *(int *)(in_RDI + 0xc) = iVar2;
        *(uint *)(in_RDI + 0x10) = local_6c & 0xfff;
        local_38 = local_38 + (ulong)(local_28 * (local_6c >> 0xc));
        uVar3 = minu(local_3c,local_6c >> 0xc);
        local_3c = local_3c - uVar3;
        local_20 = local_20 + (ulong)(local_2c * local_7c);
        local_48 = local_7c + local_48;
        goto LAB_001c4416;
      }
      for (local_58 = 0; uVar1 = local_58,
          iVar4 = al::FlexArray<SampleConverter::ChanSamples,_16UL>::size
                            ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040)),
          uVar1 < iVar4; local_58 = local_58 + 1) {
        al::FlexArray<SampleConverter::ChanSamples,_16UL>::operator[]
                  ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040),local_58);
        al::FlexArray<SampleConverter::ChanSamples,_16UL>::size
                  ((FlexArray<SampleConverter::ChanSamples,_16UL> *)(in_RDI + 0x2040));
        anon_unknown.dwarf_f0b3e::LoadSamples
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (size_t)in_stack_fffffffffffffe80,(DevFmtType)(in_stack_fffffffffffffe78 >> 0x38)
                   ,CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      }
      *(uint *)(in_RDI + 0xc) = local_4c + local_50;
      local_3c = 0;
LAB_001c4c6b:
      *local_10 = local_38;
      *local_18 = local_3c;
      FPUCtl::~FPUCtl((FPUCtl *)0x1c4ca7);
      return local_48;
    }
    if (local_3c <= (uint)-local_4c) {
      *(uint *)(in_RDI + 0xc) = local_3c + local_4c;
      local_3c = 0;
      goto LAB_001c4c6b;
    }
    local_38 = local_38 + (ulong)(uint)(local_28 * -local_4c);
    local_3c = local_3c + local_4c;
    *(undefined4 *)(in_RDI + 0xc) = 0;
  } while( true );
}

Assistant:

ALuint SampleConverter::convert(const void **src, ALuint *srcframes, void *dst, ALuint dstframes)
{
    const ALuint SrcFrameSize{static_cast<ALuint>(mChan.size()) * mSrcTypeSize};
    const ALuint DstFrameSize{static_cast<ALuint>(mChan.size()) * mDstTypeSize};
    const ALuint increment{mIncrement};
    auto SamplesIn = static_cast<const al::byte*>(*src);
    ALuint NumSrcSamples{*srcframes};

    FPUCtl mixer_mode{};
    ALuint pos{0};
    while(pos < dstframes && NumSrcSamples > 0)
    {
        int prepcount{mSrcPrepCount};
        if(prepcount < 0)
        {
            /* Negative prepcount means we need to skip that many input samples. */
            if(static_cast<ALuint>(-prepcount) >= NumSrcSamples)
            {
                mSrcPrepCount = static_cast<int>(NumSrcSamples) + prepcount;
                NumSrcSamples = 0;
                break;
            }
            SamplesIn += SrcFrameSize*static_cast<ALuint>(-prepcount);
            NumSrcSamples -= static_cast<ALuint>(-prepcount);
            mSrcPrepCount = 0;
            continue;
        }
        ALuint toread{minu(NumSrcSamples, BUFFERSIZE - MAX_RESAMPLER_PADDING)};

        if(prepcount < MAX_RESAMPLER_PADDING
            && static_cast<ALuint>(MAX_RESAMPLER_PADDING - prepcount) >= toread)
        {
            /* Not enough input samples to generate an output sample. Store
             * what we're given for later.
             */
            for(size_t chan{0u};chan < mChan.size();chan++)
                LoadSamples(&mChan[chan].PrevSamples[prepcount], SamplesIn + mSrcTypeSize*chan,
                    mChan.size(), mSrcType, toread);

            mSrcPrepCount = prepcount + static_cast<int>(toread);
            NumSrcSamples = 0;
            break;
        }

        float *RESTRICT SrcData{mSrcSamples};
        float *RESTRICT DstData{mDstSamples};
        ALuint DataPosFrac{mFracOffset};
        auto DataSize64 = static_cast<uint64_t>(prepcount);
        DataSize64 += toread;
        DataSize64 -= MAX_RESAMPLER_PADDING;
        DataSize64 <<= MixerFracBits;
        DataSize64 -= DataPosFrac;

        /* If we have a full prep, we can generate at least one sample. */
        auto DstSize = static_cast<ALuint>(
            clampu64((DataSize64 + increment-1)/increment, 1, BUFFERSIZE));
        DstSize = minu(DstSize, dstframes-pos);

        for(size_t chan{0u};chan < mChan.size();chan++)
        {
            const al::byte *SrcSamples{SamplesIn + mSrcTypeSize*chan};
            al::byte *DstSamples = static_cast<al::byte*>(dst) + mDstTypeSize*chan;

            /* Load the previous samples into the source data first, then the
             * new samples from the input buffer.
             */
            std::copy_n(mChan[chan].PrevSamples, prepcount, SrcData);
            LoadSamples(SrcData + prepcount, SrcSamples, mChan.size(), mSrcType, toread);

            /* Store as many prep samples for next time as possible, given the
             * number of output samples being generated.
             */
            ALuint SrcDataEnd{(DstSize*increment + DataPosFrac)>>MixerFracBits};
            if(SrcDataEnd >= static_cast<ALuint>(prepcount)+toread)
                std::fill(std::begin(mChan[chan].PrevSamples),
                    std::end(mChan[chan].PrevSamples), 0.0f);
            else
            {
                const size_t len{minz(al::size(mChan[chan].PrevSamples),
                    static_cast<ALuint>(prepcount)+toread-SrcDataEnd)};
                std::copy_n(SrcData+SrcDataEnd, len, mChan[chan].PrevSamples);
                std::fill(std::begin(mChan[chan].PrevSamples)+len,
                    std::end(mChan[chan].PrevSamples), 0.0f);
            }

            /* Now resample, and store the result in the output buffer. */
            const float *ResampledData{mResample(&mState, SrcData+(MAX_RESAMPLER_PADDING>>1),
                DataPosFrac, increment, {DstData, DstSize})};

            StoreSamples(DstSamples, ResampledData, mChan.size(), mDstType, DstSize);
        }

        /* Update the number of prep samples still available, as well as the
         * fractional offset.
         */
        DataPosFrac += increment*DstSize;
        mSrcPrepCount = mini(prepcount + static_cast<int>(toread - (DataPosFrac>>MixerFracBits)),
            MAX_RESAMPLER_PADDING);
        mFracOffset = DataPosFrac & MixerFracMask;

        /* Update the src and dst pointers in case there's still more to do. */
        SamplesIn += SrcFrameSize*(DataPosFrac>>MixerFracBits);
        NumSrcSamples -= minu(NumSrcSamples, (DataPosFrac>>MixerFracBits));

        dst = static_cast<al::byte*>(dst) + DstFrameSize*DstSize;
        pos += DstSize;
    }

    *src = SamplesIn;
    *srcframes = NumSrcSamples;

    return pos;
}